

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O3

void av1_initialize_rd_consts(AV1_COMP *cpi)

{
  char cVar1;
  byte bVar2;
  uint8_t uVar3;
  int iVar4;
  aom_enc_pass aVar5;
  int iVar6;
  aom_bit_depth_t bit_depth;
  INTERNAL_COST_UPDATE_TYPE IVar7;
  AV1_PRIMARY *pAVar8;
  ulong uVar9;
  FRAME_CONTEXT *pFVar10;
  double dVar11;
  double dVar12;
  INTERNAL_COST_UPDATE_TYPE IVar13;
  AV1_COMMON *cm_00;
  int16_t iVar14;
  int iVar15;
  INTERNAL_COST_UPDATE_TYPE IVar16;
  long lVar17;
  IntraBCMVCosts *mvjoint;
  uint uVar18;
  int iVar19;
  long lVar20;
  INTERNAL_COST_UPDATE_TYPE IVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  AV1_COMMON *cm;
  bool bVar26;
  bool bVar27;
  uint uVar28;
  byte local_58 [16];
  AV1_COMMON *local_48;
  int (*local_40) [22] [169];
  segmentation *local_38;
  
  pAVar8 = cpi->ppi;
  iVar4 = (pAVar8->p_rc).gfu_boost;
  iVar22 = 0xf;
  if (iVar4 < 0x640) {
    iVar22 = iVar4 / 100;
  }
  iVar4 = (pAVar8->gf_group).layer_depth[cpi->gf_frame_index];
  iVar15 = 6;
  if (iVar4 < 6) {
    iVar15 = iVar4;
  }
  aVar5 = (cpi->oxcf).pass;
  uVar18 = 1;
  if (((aVar5 < AOM_RC_LAST_PASS) && (uVar18 = 0, aVar5 == AOM_RC_ONE_PASS)) &&
     (cpi->compressor_stage == '\0')) {
    uVar18 = (uint)(pAVar8->lap_enabled != 0);
  }
  iVar4 = (cpi->sf).rt_sf.use_nonrd_pick_mode;
  iVar6 = (cpi->rc).frames_since_key;
  iVar15 = av1_compute_rd_mult((cpi->common).quant_params.y_dc_delta_q +
                               (cpi->common).quant_params.base_qindex,
                               ((cpi->common).seq_params)->bit_depth,
                               (pAVar8->gf_group).update_type[cpi->gf_frame_index],iVar15,iVar22,
                               (cpi->common).current_frame.frame_type,
                               (cpi->oxcf).q_cfg.use_fixed_qp_offsets,uVar18,
                               (cpi->oxcf).tune_cfg.tuning);
  (cpi->rd).RDMULT = iVar15;
  iVar22 = 1;
  if (1 < iVar15 >> 6) {
    iVar22 = iVar15 >> 6;
  }
  (cpi->td).mb.errorperbit = iVar22;
  iVar22 = (cpi->sf).rt_sf.use_nonrd_pick_mode;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  if (iVar22 == 0) {
    uVar18 = 0xa9;
  }
  else {
    lVar17 = 0;
    lVar20 = 0;
    do {
      cVar1 = real_time_ref_combos[lVar17][0];
      lVar20 = (long)(int)lVar20;
      if ((long)cVar1 == 0) {
        lVar25 = 0;
        do {
          local_58[lVar25 + lVar20] =
               mode_idx[0][*(long *)(&DAT_004fe8d8 + (long)(char)""[lVar25] * 8)];
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
      }
      else {
        lVar25 = 0;
        do {
          local_58[lVar25 + lVar20] =
               *(byte *)((ulong)"\r\x0e\x0f\x10"[lVar25] + (long)cVar1 * 4 + 0x4feba3);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
      }
      lVar20 = lVar20 + 4;
      uVar18 = (uint)lVar20;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
  }
  local_48 = &cpi->common;
  local_38 = &(cpi->common).seg;
  local_40 = (cpi->rd).threshes;
  lVar17 = 0;
  do {
    iVar15 = av1_get_qindex(local_38,(int)lVar17,(cpi->common).quant_params.base_qindex);
    iVar15 = iVar15 + (cpi->common).quant_params.y_dc_delta_q;
    if (0xfe < iVar15) {
      iVar15 = 0xff;
    }
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    bit_depth = ((cpi->common).seq_params)->bit_depth;
    uVar28 = 0x3fd00000;
    if (bit_depth == AOM_BITS_8) {
LAB_00206753:
      iVar14 = av1_dc_quant_QTX(iVar15,0,bit_depth);
      dVar11 = (double)(int)iVar14 * (double)((ulong)uVar28 << 0x20);
      dVar12 = pow(dVar11,1.25);
      iVar19 = 8;
      if (8 < (int)(dVar12 * 5.12)) {
        dVar11 = pow(dVar11,1.25);
        iVar19 = (int)(dVar11 * 5.12);
      }
    }
    else {
      if (bit_depth == AOM_BITS_12) {
        uVar28 = 0x3f900000;
        goto LAB_00206753;
      }
      iVar19 = -1;
      if (bit_depth == AOM_BITS_10) {
        uVar28 = 0x3fb00000;
        goto LAB_00206753;
      }
    }
    cm_00 = local_48;
    lVar20 = 0;
    do {
      bVar2 = "\x02\x03\x03\x04\x06\x06\b\f\f\x10\x18\x18 00@\x04\x04\b\b\x10\x10"[lVar20];
      if (0 < (int)uVar18) {
        uVar23 = 0;
        do {
          uVar28 = (uint)uVar23;
          if (iVar22 != 0) {
            uVar28 = (uint)local_58[uVar23];
          }
          iVar15 = (cpi->rd).thresh_mult[uVar28];
          iVar24 = 0x7fffffff;
          if (iVar15 < (int)(0x7fffffff / (long)(int)((uint)bVar2 * iVar19))) {
            iVar15 = iVar15 * (uint)bVar2 * iVar19;
            iVar24 = iVar15 + 3;
            if (-1 < iVar15) {
              iVar24 = iVar15;
            }
            iVar24 = iVar24 >> 2;
          }
          local_40[lVar17][lVar20][uVar28] = iVar24;
          uVar23 = uVar23 + 1;
        } while (uVar18 != uVar23);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x16);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 8);
  uVar23._0_4_ = (cpi->oxcf).cost_upd_freq.mv;
  uVar23._4_4_ = (cpi->oxcf).cost_upd_freq.dv;
  IVar7 = (cpi->sf).inter_sf.mv_cost_upd_level;
  IVar13 = *(INTERNAL_COST_UPDATE_TYPE *)
            (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
            (uVar23 & 0xffffffff) * 4);
  if (IVar7 < *(INTERNAL_COST_UPDATE_TYPE *)
               (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
               (uVar23 & 0xffffffff) * 4)) {
    IVar13 = IVar7;
  }
  uVar9._0_4_ = (cpi->oxcf).cost_upd_freq.coeff;
  uVar9._4_4_ = (cpi->oxcf).cost_upd_freq.mode;
  (cpi->sf).inter_sf.mv_cost_upd_level = IVar13;
  IVar7 = (cpi->sf).inter_sf.coeff_cost_upd_level;
  IVar16 = *(INTERNAL_COST_UPDATE_TYPE *)
            (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
            (uVar9 & 0xffffffff) * 4);
  if (IVar7 < *(INTERNAL_COST_UPDATE_TYPE *)
               (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
               (uVar9 & 0xffffffff) * 4)) {
    IVar16 = IVar7;
  }
  (cpi->sf).inter_sf.coeff_cost_upd_level = IVar16;
  IVar7 = (cpi->sf).inter_sf.mode_cost_upd_level;
  IVar21 = *(INTERNAL_COST_UPDATE_TYPE *)
            (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
            (uVar9 >> 0x20) * 4);
  if (IVar7 < *(INTERNAL_COST_UPDATE_TYPE *)
               (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
               (uVar9 >> 0x20) * 4)) {
    IVar21 = IVar7;
  }
  (cpi->sf).inter_sf.mode_cost_upd_level = IVar21;
  IVar7 = (cpi->sf).intra_sf.dv_cost_upd_level;
  IVar21 = *(INTERNAL_COST_UPDATE_TYPE *)
            (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
            (uVar23 >> 0x20) * 4);
  if (IVar7 < *(INTERNAL_COST_UPDATE_TYPE *)
               (populate_unified_cost_update_freq_map_cost_upd_to_internal_cost_upd +
               (uVar23 >> 0x20) * 4)) {
    IVar21 = IVar7;
  }
  (cpi->sf).intra_sf.dv_cost_upd_level = IVar21;
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
LAB_00206918:
    bVar26 = iVar4 == 0;
    av1_fill_mv_costs(&((cpi->common).fc)->nmvc,
                      (uint)(cpi->common).features.cur_frame_force_integer_mv,
                      (uint)(cpi->common).features.allow_high_precision_mv,(cpi->td).mb.mv_costs);
    if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
      IVar16 = (cpi->sf).inter_sf.coeff_cost_upd_level;
      if (!bVar26) goto LAB_0020690d;
LAB_00206952:
      bVar27 = ((cpi->common).current_frame.frame_number & 7) == 1;
      bVar26 = true;
      goto LAB_00206964;
    }
LAB_00206977:
    av1_fill_coeff_costs
              (&(cpi->td).mb.coeff_costs,(cpi->common).fc,
               (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
  }
  else {
    if (iVar4 == 0) {
      bVar26 = ((cpi->common).current_frame.frame_number & 7) == 1;
    }
    else {
      bVar26 = iVar6 < 2;
    }
    if (((IVar13 == INTERNAL_COST_UPD_TILE) || (IVar13 != INTERNAL_COST_UPD_OFF && iVar4 == 0)) ||
       (bVar26)) goto LAB_00206918;
    if (iVar4 == 0) goto LAB_00206952;
LAB_0020690d:
    bVar27 = iVar6 < 2;
    bVar26 = false;
LAB_00206964:
    if (((IVar16 == INTERNAL_COST_UPD_TILE) || ((bool)(IVar16 != INTERNAL_COST_UPD_OFF & bVar26)))
       || (bVar27)) goto LAB_00206977;
  }
  if ((cpi->sf).rt_sf.frame_level_mode_cost_update == true) {
    uVar3 = (cpi->oxcf).algo_cfg.cdf_update_mode;
    if (uVar3 != '\x01') {
      if ((uVar3 == '\x02') && (cpi->frames_since_last_update == 1)) goto LAB_00206a97;
      goto LAB_00206a58;
    }
    iVar4 = (cpi->svc).number_temporal_layers;
    if (iVar4 == 1 && (cpi->svc).number_spatial_layers == 1) {
      if ((((cm_00->current_frame).frame_type & 0xfd) != 0) &&
         ((((iVar4 = (cpi->resize_pending_params).width, iVar4 == 0 ||
            (iVar22 = (cpi->resize_pending_params).height, iVar22 == 0)) ||
           (((cpi->common).width == iVar4 && ((cpi->common).height == iVar22)))) &&
          (((((cpi->rc).high_source_sad == 0 && (9 < (cpi->rc).frames_since_key)) &&
            (9 < cpi->cyclic_refresh->counter_encode_maxq_scene_change)) &&
           (((cpi->common).current_frame.frame_number & 7) != 0)))))) goto LAB_00206a58;
    }
    else if ((iVar4 < 2) || ((cpi->svc).temporal_layer_id == iVar4 + -1)) goto LAB_00206a58;
  }
  else {
LAB_00206a58:
    if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
      IVar7 = (cpi->sf).inter_sf.mode_cost_upd_level;
      if (bVar26) {
        bVar27 = ((cpi->common).current_frame.frame_number & 7) == 1;
      }
      else {
        bVar27 = iVar6 < 2;
      }
      if (((IVar7 != INTERNAL_COST_UPD_TILE) && (!(bool)(bVar26 & IVar7 != INTERNAL_COST_UPD_OFF)))
         && (!bVar27)) goto LAB_00206aad;
    }
  }
LAB_00206a97:
  av1_fill_mode_rates(cm_00,&(cpi->td).mb.mode_costs,(cpi->common).fc);
LAB_00206aad:
  if ((((((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) &&
        (((cm_00->current_frame).frame_type & 0xfd) == 0)) &&
       ((cpi->common).features.allow_screen_content_tools == true)) &&
      (((cpi->common).features.allow_intrabc != false && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS))))
     && (cpi->compressor_stage != '\x01')) {
    if ((cpi->td).dv_costs_alloc == (IntraBCMVCosts *)0x0) {
      mvjoint = (IntraBCMVCosts *)aom_malloc(0x40018);
      (cpi->td).dv_costs_alloc = mvjoint;
      if (mvjoint == (IntraBCMVCosts *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cpi->td.dv_costs_alloc");
        mvjoint = (cpi->td).dv_costs_alloc;
      }
      (cpi->td).mb.dv_costs = mvjoint;
    }
    else {
      mvjoint = (cpi->td).mb.dv_costs;
    }
    pFVar10 = (cpi->common).fc;
    mvjoint->dv_costs[0] = mvjoint->dv_costs_alloc[0] + 0x3fff;
    mvjoint->dv_costs[1] = mvjoint->dv_costs_alloc[1] + 0x3fff;
    av1_build_nmv_cost_table(mvjoint->joint_mv,mvjoint->dv_costs,&pFVar10->ndvc,-1);
    return;
  }
  return;
}

Assistant:

void av1_initialize_rd_consts(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &cpi->td.mb;
  SPEED_FEATURES *const sf = &cpi->sf;
  RD_OPT *const rd = &cpi->rd;
  int use_nonrd_pick_mode = cpi->sf.rt_sf.use_nonrd_pick_mode;
  int frames_since_key = cpi->rc.frames_since_key;

  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  const int qindex_rdmult =
      cm->quant_params.base_qindex + cm->quant_params.y_dc_delta_q;
  rd->RDMULT = av1_compute_rd_mult(
      qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);
#if CONFIG_RD_COMMAND
  if (cpi->oxcf.pass == 2) {
    const RD_COMMAND *rd_command = &cpi->rd_command;
    if (rd_command->option_ls[rd_command->frame_index] ==
        RD_OPTION_SET_Q_RDMULT) {
      rd->RDMULT = rd_command->rdmult_ls[rd_command->frame_index];
    }
  }
#endif  // CONFIG_RD_COMMAND

  av1_set_error_per_bit(&x->errorperbit, rd->RDMULT);

  set_block_thresholds(cm, rd, cpi->sf.rt_sf.use_nonrd_pick_mode);

  populate_unified_cost_update_freq(cpi->oxcf.cost_upd_freq, sf);
  const INTER_MODE_SPEED_FEATURES *const inter_sf = &cpi->sf.inter_sf;
  // Frame level mv cost update
  if (is_frame_level_cost_upd_freq_set(cm, inter_sf->mv_cost_upd_level,
                                       use_nonrd_pick_mode, frames_since_key))
    av1_fill_mv_costs(&cm->fc->nmvc, cm->features.cur_frame_force_integer_mv,
                      cm->features.allow_high_precision_mv, x->mv_costs);

  // Frame level coefficient cost update
  if (is_frame_level_cost_upd_freq_set(cm, inter_sf->coeff_cost_upd_level,
                                       use_nonrd_pick_mode, frames_since_key))
    av1_fill_coeff_costs(&x->coeff_costs, cm->fc, av1_num_planes(cm));

  // Frame level mode cost update
  if (should_force_mode_cost_update(cpi) ||
      is_frame_level_cost_upd_freq_set(cm, inter_sf->mode_cost_upd_level,
                                       use_nonrd_pick_mode, frames_since_key))
    av1_fill_mode_rates(cm, &x->mode_costs, cm->fc);

  // Frame level dv cost update
  if (av1_need_dv_costs(cpi)) {
    if (cpi->td.dv_costs_alloc == NULL) {
      CHECK_MEM_ERROR(
          cm, cpi->td.dv_costs_alloc,
          (IntraBCMVCosts *)aom_malloc(sizeof(*cpi->td.dv_costs_alloc)));
      cpi->td.mb.dv_costs = cpi->td.dv_costs_alloc;
    }
    av1_fill_dv_costs(&cm->fc->ndvc, x->dv_costs);
  }
}